

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

void __thiscall Js::IndexPropertyDescriptorMap::EnsureIndexList(IndexPropertyDescriptorMap *this)

{
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  uint32 uVar2;
  Recycler *this_00;
  uint *ptr;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t count;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if ((this->indexList).ptr != (uint *)0x0) {
    return;
  }
  pBVar1 = (this->indexPropertyMap).ptr;
  uVar3 = pBVar1->count - pBVar1->freeCount;
  count = (size_t)(int)uVar3;
  local_58 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_9953769;
  data.filename._0_4_ = 0x3a;
  data.plusSize = count;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
  uVar4 = 0;
  ptr = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                  ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
  Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierSet(&this->indexList,ptr);
  this->lastIndexAt = -1;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    uVar2 = GetKeyAt(this,(int)uVar4);
    (this->indexList).ptr[uVar4] = uVar2;
  }
  qsort((this->indexList).ptr,count,4,CompareIndex);
  return;
}

Assistant:

void IndexPropertyDescriptorMap::EnsureIndexList()
    {
        if (!indexList)
        {
            int length = Count();
            indexList = RecyclerNewArrayLeaf(recycler, uint32, length);
            lastIndexAt = -1; // Reset lastAccessorIndexAt

            for (int i = 0; i < length; i++)
            {
                indexList[i] = GetKeyAt(i);
            }

            ::qsort(indexList, length, sizeof(uint32), &CompareIndex);
        }
    }